

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_websocket.hpp
# Opt level: O0

void __thiscall
m2d::savanna::async_websocket::
reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>
::on_read(reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>
          *this,error_code ec,flat_buffer *buffer,size_t bytes_transferred)

{
  bool bVar1;
  reference_type __x;
  element_type *peVar2;
  undefined1 local_70 [8];
  function<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&)> handler;
  _func_int **local_40;
  size_t bytes_transferred_local;
  flat_buffer *buffer_local;
  reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>
  *this_local;
  error_code ec_local;
  
  ec_local._0_8_ = ec.cat_;
  this_local = ec._0_8_;
  ec_local.cat_ = (error_category *)&stack0xffffffffffffffc0;
  local_40 = (_func_int **)bytes_transferred;
  bytes_transferred_local = (size_t)buffer;
  buffer_local = (flat_buffer *)this;
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&this_local);
  if (bVar1) {
    handler._M_invoker = (_Invoker_type)this_local;
    (*(this->super_delegate)._vptr_delegate[3])(this,this_local,ec_local._0_8_);
  }
  else {
    bVar1 = boost::
            optional<std::function<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&)>_>
            ::operator!(&this->on_message_handler_);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      __x = boost::
            optional<std::function<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&)>_>
            ::operator*(&this->on_message_handler_);
      std::function<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&)>::function
                ((function<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&)> *)
                 local_70,__x);
      std::function<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&)>::operator()
                ((function<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&)> *)
                 local_70,buffer);
      std::function<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&)>::~function
                ((function<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&)> *)
                 local_70);
    }
    peVar2 = std::
             __shared_ptr_access<m2d::savanna::async_websocket::interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<m2d::savanna::async_websocket::interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->interface_);
    (*peVar2->_vptr_interface[0xe])();
  }
  return;
}

Assistant:

void on_read(beast::error_code ec, beast::flat_buffer buffer, std::size_t bytes_transferred) override
			{
				boost::ignore_unused(bytes_transferred);

				if (ec) {
					on_error(ec);
					return;
				}

				if (on_message_handler_) {
					auto handler = *on_message_handler_;
					handler(buffer);
				}

				interface_->read();
			}